

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::RunContext::RunContext(RunContext *this,IConfigPtr *_config,IStreamingReporterPtr *reporter)

{
  uint uVar1;
  int iVar2;
  element_type *peVar3;
  IMutableContext *pIVar4;
  pointer pIVar5;
  IResultCapture *in_RDI;
  string *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined2 in_stack_ffffffffffffff24;
  undefined1 in_stack_ffffffffffffff26;
  undefined1 in_stack_ffffffffffffff27;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  byte bStack_45;
  string local_38 [56];
  
  IResultCapture::IResultCapture(in_RDI);
  IRunner::IRunner((IRunner *)(in_RDI + 1));
  in_RDI->_vptr_IResultCapture = (_func_int **)&PTR__RunContext_00389c00;
  in_RDI[1]._vptr_IResultCapture = (_func_int **)&PTR__RunContext_00389cc0;
  peVar3 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x283942);
  (*(peVar3->super_NonCopyable)._vptr_NonCopyable[4])(local_38);
  TestRunInfo::TestRunInfo
            ((TestRunInfo *)
             CONCAT17(in_stack_ffffffffffffff27,
                      CONCAT16(in_stack_ffffffffffffff26,
                               CONCAT24(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20))),
             in_stack_ffffffffffffff18);
  std::__cxx11::string::~string(local_38);
  pIVar4 = getCurrentMutableContext();
  in_RDI[6]._vptr_IResultCapture = (_func_int **)pIVar4;
  in_RDI[7]._vptr_IResultCapture = (_func_int **)0x0;
  in_RDI[8]._vptr_IResultCapture = (_func_int **)0x0;
  Option<Catch::AssertionResult>::Option((Option<Catch::AssertionResult> *)(in_RDI + 9));
  clara::std::shared_ptr<const_Catch::IConfig>::shared_ptr
            ((shared_ptr<const_Catch::IConfig> *)
             CONCAT17(in_stack_ffffffffffffff27,
                      CONCAT16(in_stack_ffffffffffffff26,
                               CONCAT24(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20))),
             (shared_ptr<const_Catch::IConfig> *)in_stack_ffffffffffffff18);
  Totals::Totals((Totals *)
                 CONCAT17(in_stack_ffffffffffffff27,
                          CONCAT16(in_stack_ffffffffffffff26,
                                   CONCAT24(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20))));
  clara::std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
  ::unique_ptr((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                *)CONCAT17(in_stack_ffffffffffffff27,
                           CONCAT16(in_stack_ffffffffffffff26,
                                    CONCAT24(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20))),
               (unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                *)in_stack_ffffffffffffff18);
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)0x283a49);
  clara::std::vector<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>::vector
            ((vector<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_> *)0x283a62);
  in_RDI[0x2c]._vptr_IResultCapture = (_func_int **)0x0;
  in_RDI[0x2d]._vptr_IResultCapture = (_func_int **)0x0;
  StringRef::StringRef((StringRef *)(in_RDI + 0x2c));
  SourceLineInfo::SourceLineInfo((SourceLineInfo *)(in_RDI + 0x2e),"",0);
  in_RDI[0x30]._vptr_IResultCapture = (_func_int **)0x0;
  in_RDI[0x31]._vptr_IResultCapture = (_func_int **)0x0;
  StringRef::StringRef((StringRef *)(in_RDI + 0x30));
  *(undefined4 *)&in_RDI[0x32]._vptr_IResultCapture = 1;
  clara::std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>::vector
            ((vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_> *)0x283aed);
  clara::std::
  vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
  ::vector((vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
            *)0x283b06);
  TestCaseTracking::TrackerContext::TrackerContext
            ((TrackerContext *)
             CONCAT17(in_stack_ffffffffffffff27,
                      CONCAT16(in_stack_ffffffffffffff26,
                               CONCAT24(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20))));
  FatalConditionHandler::FatalConditionHandler
            ((FatalConditionHandler *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30))
  ;
  *(undefined1 *)((long)&in_RDI[0x3d]._vptr_IResultCapture + 1) = 0;
  *(undefined1 *)((long)&in_RDI[0x3d]._vptr_IResultCapture + 2) = 1;
  peVar3 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x283b6a);
  uVar1 = (*(peVar3->super_NonCopyable)._vptr_NonCopyable[5])();
  bStack_45 = 1;
  if ((uVar1 & 1) == 0) {
    pIVar5 = clara::std::
             unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
             ::operator->((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                           *)0x283ba1);
    iVar2 = (*pIVar5->_vptr_IStreamingReporter[2])();
    bStack_45 = (byte)((uint)iVar2 >> 8);
  }
  *(byte *)((long)&in_RDI[0x3d]._vptr_IResultCapture + 3) = bStack_45 & 1;
  (**(code **)(*in_RDI[6]._vptr_IResultCapture + 0x30))(in_RDI[6]._vptr_IResultCapture,in_RDI + 1);
  (**(code **)(*in_RDI[6]._vptr_IResultCapture + 0x38))
            (in_RDI[6]._vptr_IResultCapture,in_RDI + 0x1c);
  (**(code **)(*in_RDI[6]._vptr_IResultCapture + 0x28))();
  pIVar5 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                       *)0x283c3e);
  (*pIVar5->_vptr_IStreamingReporter[5])(pIVar5,in_RDI + 2);
  return;
}

Assistant:

RunContext::RunContext(IConfigPtr const& _config, IStreamingReporterPtr&& reporter)
    :   m_runInfo(_config->name()),
        m_context(getCurrentMutableContext()),
        m_config(_config),
        m_reporter(std::move(reporter)),
        m_lastAssertionInfo{ StringRef(), SourceLineInfo("",0), StringRef(), ResultDisposition::Normal },
        m_includeSuccessfulResults( m_config->includeSuccessfulResults() || m_reporter->getPreferences().shouldReportAllAssertions )
    {
        m_context.setRunner(this);
        m_context.setConfig(m_config);
        m_context.setResultCapture(this);
        m_reporter->testRunStarting(m_runInfo);
    }